

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O2

Sector * GetTypicalSector(Sector *__return_storage_ptr__,CylHead *cylhead,Track *track,Sector *last)

{
  DataRate *__k;
  Encoding *__k_00;
  int *piVar1;
  int *__k_01;
  int *__k_02;
  int iVar2;
  pointer pSVar3;
  mapped_type *pmVar4;
  Sector *pSVar5;
  Sector *sector;
  pointer __k_03;
  int *piVar6;
  int *__k_04;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> heads;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> cyls;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> sizes;
  map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
  encodings;
  map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
  datarates;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> gap3s;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_150;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_120;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_f0;
  _Rb_tree<Encoding,_std::pair<const_Encoding,_int>,_std::_Select1st<std::pair<const_Encoding,_int>_>,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
  local_c0;
  _Rb_tree<DataRate,_std::pair<const_DataRate,_int>,_std::_Select1st<std::pair<const_DataRate,_int>_>,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_150._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_150._M_impl.super__Rb_tree_header._M_header;
  local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_150._M_impl.super__Rb_tree_header._M_header._M_right =
       local_150._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  Sector::Sector(__return_storage_ptr__,last);
  pSVar3 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __k = &__return_storage_ptr__->datarate;
  __k_00 = &__return_storage_ptr__->encoding;
  piVar1 = &(__return_storage_ptr__->header).head;
  __k_01 = &(__return_storage_ptr__->header).size;
  __k_02 = &__return_storage_ptr__->gap3;
  for (__k_03 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                super__Vector_impl_data._M_start; __k_03 != pSVar3; __k_03 = __k_03 + 1) {
    pmVar4 = std::
             map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
             ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                           *)&local_90,&__k_03->datarate);
    iVar2 = *pmVar4;
    *pmVar4 = iVar2 + 1;
    pmVar4 = std::
             map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
             ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                           *)&local_90,__k);
    if (*pmVar4 <= iVar2) {
      *__k = __k_03->datarate;
    }
    pmVar4 = std::
             map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
             ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                           *)&local_c0,&__k_03->encoding);
    iVar2 = *pmVar4;
    *pmVar4 = iVar2 + 1;
    pmVar4 = std::
             map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
             ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                           *)&local_c0,__k_00);
    if (*pmVar4 <= iVar2) {
      *__k_00 = __k_03->encoding;
    }
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_120,(key_type *)__k_03);
    iVar2 = *pmVar4;
    *pmVar4 = iVar2 + 1;
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_120,(key_type *)__return_storage_ptr__);
    if (*pmVar4 <= iVar2) {
      (__return_storage_ptr__->header).cyl = (__k_03->header).cyl;
    }
    piVar6 = &(__k_03->header).head;
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_150,piVar6);
    iVar2 = *pmVar4;
    *pmVar4 = iVar2 + 1;
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_150,piVar1);
    if (*pmVar4 <= iVar2) {
      *piVar1 = *piVar6;
    }
    piVar6 = &(__k_03->header).size;
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_f0,piVar6);
    iVar2 = *pmVar4;
    *pmVar4 = iVar2 + 1;
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_f0,__k_01);
    if (*pmVar4 <= iVar2) {
      *__k_01 = *piVar6;
    }
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_60,&__k_03->gap3);
    iVar2 = *pmVar4;
    *pmVar4 = iVar2 + 1;
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_60,__k_02);
    if (*pmVar4 <= iVar2) {
      *__k_02 = __k_03->gap3;
    }
  }
  pmVar4 = std::
           map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
           ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                         *)&local_90,__k);
  iVar2 = *pmVar4;
  pmVar4 = std::
           map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
           ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                         *)&local_90,&last->datarate);
  if (iVar2 == *pmVar4) {
    *__k = last->datarate;
  }
  pmVar4 = std::
           map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
           ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                         *)&local_c0,__k_00);
  iVar2 = *pmVar4;
  pmVar4 = std::
           map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
           ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                         *)&local_c0,&last->encoding);
  if (iVar2 == *pmVar4) {
    *__k_00 = last->encoding;
  }
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_120,(key_type *)__return_storage_ptr__);
  iVar2 = *pmVar4;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_120,&cylhead->cyl);
  pSVar5 = (Sector *)cylhead;
  if (iVar2 == *pmVar4) {
LAB_0016496d:
    (__return_storage_ptr__->header).cyl = (pSVar5->header).cyl;
  }
  else {
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_120,(key_type *)__return_storage_ptr__);
    iVar2 = *pmVar4;
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_120,(key_type *)last);
    pSVar5 = last;
    if ((iVar2 == *pmVar4) ||
       (pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_120,(key_type *)__return_storage_ptr__),
       pSVar5 = (Sector *)cylhead, *pmVar4 == 1)) goto LAB_0016496d;
  }
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_150,piVar1);
  iVar2 = *pmVar4;
  __k_04 = &cylhead->head;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_150,__k_04);
  piVar6 = __k_04;
  if (iVar2 != *pmVar4) {
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_150,piVar1);
    iVar2 = *pmVar4;
    piVar6 = &(last->header).head;
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_150,piVar6);
    if ((iVar2 != *pmVar4) &&
       (pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_150,piVar1), piVar6 = __k_04, *pmVar4 != 1))
    goto LAB_001649eb;
  }
  *piVar1 = *piVar6;
LAB_001649eb:
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_f0,__k_01);
  iVar2 = *pmVar4;
  piVar1 = &(last->header).size;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_f0,piVar1);
  if (iVar2 == *pmVar4) {
    *__k_01 = *piVar1;
  }
  if (last->gap3 != 0) {
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_60,&last->gap3);
    if ((*pmVar4 != 0) || (*__k_02 == 0)) {
      *__k_02 = last->gap3;
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_150);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_120);
  std::
  _Rb_tree<Encoding,_std::pair<const_Encoding,_int>,_std::_Select1st<std::pair<const_Encoding,_int>_>,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<DataRate,_std::pair<const_DataRate,_int>,_std::_Select1st<std::pair<const_DataRate,_int>_>,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
  ::~_Rb_tree(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Sector GetTypicalSector(const CylHead& cylhead, const Track& track, const Sector& last)
{
    std::map<DataRate, int> datarates;
    std::map<Encoding, int> encodings;
    std::map<int, int> cyls, heads, sizes, gap3s;

    Sector typical = last;

    // Find the most common values
    for (const auto& sector : track)
    {
        if (++datarates[sector.datarate] > datarates[typical.datarate])
            typical.datarate = sector.datarate;

        if (++encodings[sector.encoding] > encodings[typical.encoding])
            typical.encoding = sector.encoding;

        if (++cyls[sector.header.cyl] > cyls[typical.header.cyl])
            typical.header.cyl = sector.header.cyl;

        if (++heads[sector.header.head] > heads[typical.header.head])
            typical.header.head = sector.header.head;

        if (++sizes[sector.header.size] > sizes[typical.header.size])
            typical.header.size = sector.header.size;

        if (++gap3s[sector.gap3] > gap3s[typical.gap3])
            typical.gap3 = sector.gap3;
    }

    // Use the previous values if the typical values are no better,
    // except for cyl and head where we favour the physical position
    // and prevent a single different sector changing the values.

    if (datarates[typical.datarate] == datarates[last.datarate])
        typical.datarate = last.datarate;

    if (encodings[typical.encoding] == encodings[last.encoding])
        typical.encoding = last.encoding;

    if (cyls[typical.header.cyl] == cyls[cylhead.cyl])
        typical.header.cyl = cylhead.cyl;
    else if (cyls[typical.header.cyl] == cyls[last.header.cyl])
        typical.header.cyl = last.header.cyl;
    else if (cyls[typical.header.cyl] == 1)
        typical.header.cyl = cylhead.cyl;

    if (heads[typical.header.head] == heads[cylhead.head])
        typical.header.head = cylhead.head;
    else if (heads[typical.header.head] == heads[last.header.head])
        typical.header.head = last.header.head;
    else if (heads[typical.header.head] == 1)
        typical.header.head = cylhead.head;

    if (sizes[typical.header.size] == sizes[last.header.size])
        typical.header.size = last.header.size;

    // Use previous gap3 if still present, or if no new gap3 was found.
    if (last.gap3 && (gap3s[last.gap3] || !typical.gap3))
        typical.gap3 = last.gap3;

    return typical;
}